

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O3

void __thiscall
blockencodings_tests::TransactionsRequestSerializationTest::test_method
          (TransactionsRequestSerializationTest *this)

{
  int iVar1;
  size_t __nbytes;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  readonly_property<bool> rVar4;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  lazy_ostream local_1d8;
  undefined1 *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  DataStream local_198;
  string *local_170;
  string *local_168;
  string **local_160;
  char *local_158;
  assertion_result local_150;
  undefined **local_138;
  undefined1 local_130;
  undefined1 *local_128;
  string **local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  string **local_100;
  string local_f8;
  string local_d8;
  BlockTransactionsRequest req2;
  uchar local_78 [8];
  uchar auStack_70 [8];
  uchar local_68 [8];
  uchar auStack_60 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output.m_size = 0x20;
  output.m_data = (byte *)&req2;
  FastRandomContext::fillrand
            (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_rng,output);
  local_68[0] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_68[1] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_68[2] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_68[3] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_68[4] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x14];
  local_68[5] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x15];
  local_68[6] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x16];
  local_68[7] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x17];
  auStack_60[0] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x18];
  auStack_60[1] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x19];
  auStack_60[2] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a];
  auStack_60[3] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b];
  auStack_60[4] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c];
  auStack_60[5] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d];
  auStack_60[6] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e];
  auStack_60[7] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_78[0] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0];
  local_78[1] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[1];
  local_78[2] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[2];
  local_78[3] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[3];
  local_78[4] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[4];
  local_78[5] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[5];
  local_78[6] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[6];
  local_78[7] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[7];
  auStack_70[0] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[8];
  auStack_70[1] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[9];
  auStack_70[2] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[10];
  auStack_70[3] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
  auStack_70[4] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
  auStack_70[5] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
  auStack_70[6] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
  auStack_70[7] = req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&local_58,4);
  __nbytes = 0x4000300010000;
  *(string **)
   local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
   super__Vector_impl_data._M_start = (string *)0x4000300010000;
  local_198.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.m_read_pos = 0;
  local_198.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BlockTransactionsRequest::
  SerializationOps<DataStream,BlockTransactionsRequest_const,ActionSerialize>();
  req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DataStream::read(&local_198,(int)&req2,(void *)0x20,__nbytes);
  VectorFormatter<DifferenceFormatter>::
  Unser<DataStream,std::vector<unsigned_short,std::allocator<unsigned_short>>>
            ((VectorFormatter<DifferenceFormatter> *)&local_118,&local_198,&req2.indexes);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x174;
  file.m_begin = (iterator)&local_1a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b8,msg);
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_d8,local_78);
  base_blob<256u>::ToString_abi_cxx11_(&local_f8,&req2);
  if (local_d8._M_string_length == local_f8._M_string_length) {
    if (local_d8._M_string_length == 0) {
      rVar4.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar1 = bcmp((void *)CONCAT71(local_d8._M_dataplus._M_p._1_7_,local_d8._M_dataplus._M_p._0_1_)
                   ,local_f8._M_dataplus._M_p,local_d8._M_string_length);
      rVar4.super_class_property<bool>.value = (class_property<bool>)(iVar1 == 0);
    }
  }
  else {
    rVar4.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar4.super_class_property<bool>.value;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_160 = (string **)0xe406e3;
  local_158 = "";
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01388fc8;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01388fc8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_170 = &local_f8;
  local_168 = &local_d8;
  local_120 = &local_170;
  local_100 = &local_168;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_1d8,1,2,REQUIRE,0xe40de7,(size_t)&local_160,0x174,&local_118,
             "req2.blockhash.ToString()",&local_138);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d8._M_dataplus._M_p._1_7_,local_d8._M_dataplus._M_p._0_1_) !=
      &local_d8.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_d8._M_dataplus._M_p._1_7_,local_d8._M_dataplus._M_p._0_1_),
                    local_d8.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x175;
  file_00.m_begin = (iterator)&local_1e8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1f8,
             msg_00);
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_168 = (string *)
              ((long)local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 1);
  local_170 = (string *)
              ((long)req2.indexes.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)req2.indexes.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start >> 1);
  local_d8._M_dataplus._M_p._0_1_ = local_168 == local_170;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_f8._M_string_length = 0xe40750;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01388f48;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (string **)&local_150;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01388f48;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = (string **)&local_160;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_160 = &local_170;
  local_150._0_8_ = &local_168;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,&local_1d8,1,2,REQUIRE,0xe40e1b,(size_t)&local_f8,0x175,
             &local_118,"req2.indexes.size()",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x176;
  file_01.m_begin = (iterator)&local_208;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_218,
             msg_01);
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_d8._M_dataplus._M_p._0_1_ =
       *local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start ==
       *req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_f8._M_string_length = 0xe40750;
  local_150._0_8_ =
       local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01389bb8;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (string **)&local_150;
  local_160 = (string **)
              req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01389bb8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = (string **)&local_160;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,&local_1d8,1,2,REQUIRE,0xe40e43,(size_t)&local_f8,0x176,
             &local_118,"req2.indexes[0]",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x177;
  file_02.m_begin = (iterator)&local_228;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_238,
             msg_02);
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_150._0_8_ =
       (long)local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start + 2;
  local_d8._M_dataplus._M_p._0_1_ =
       *(unsigned_short *)
        ((long)local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start + 2) ==
       req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  local_160 = (string **)
              (req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_f8._M_string_length = 0xe40750;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01389bb8;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (string **)&local_150;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01389bb8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = (string **)&local_160;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,&local_1d8,1,2,REQUIRE,0xe40e63,(size_t)&local_f8,0x177,
             &local_118,"req2.indexes[1]",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x178;
  file_03.m_begin = (iterator)&local_248;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_258,
             msg_03);
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_150._0_8_ =
       (long)local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start + 4;
  local_d8._M_dataplus._M_p._0_1_ =
       *(unsigned_short *)
        ((long)local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start + 4) ==
       req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  local_160 = (string **)
              (req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start + 2);
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_f8._M_string_length = 0xe40750;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01389bb8;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (string **)&local_150;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01389bb8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = (string **)&local_160;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,&local_1d8,1,2,REQUIRE,0xe40f42,(size_t)&local_f8,0x178,
             &local_118,"req2.indexes[2]",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x179;
  file_04.m_begin = (iterator)&local_268;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_278,
             msg_04);
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_150._0_8_ =
       (long)local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start + 6;
  local_d8._M_dataplus._M_p._0_1_ =
       *(unsigned_short *)
        ((long)local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start + 6) ==
       req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start[3];
  local_160 = (string **)
              (req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start + 3);
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_f8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_f8._M_string_length = 0xe40750;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_01389bb8;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (string **)&local_150;
  local_130 = 0;
  local_138 = &PTR__lazy_ostream_01389bb8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = (string **)&local_160;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d8,&local_1d8,1,2,REQUIRE,0xe40e93,(size_t)&local_f8,0x179,
             &local_118,"req2.indexes[3]",&local_138);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_d8.field_2._M_allocated_capacity);
  if (req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)req2.indexes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)req2.indexes.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_198);
  if ((string **)
      local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (string **)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(TransactionsRequestSerializationTest) {
    BlockTransactionsRequest req1;
    req1.blockhash = m_rng.rand256();
    req1.indexes.resize(4);
    req1.indexes[0] = 0;
    req1.indexes[1] = 1;
    req1.indexes[2] = 3;
    req1.indexes[3] = 4;

    DataStream stream{};
    stream << req1;

    BlockTransactionsRequest req2;
    stream >> req2;

    BOOST_CHECK_EQUAL(req1.blockhash.ToString(), req2.blockhash.ToString());
    BOOST_CHECK_EQUAL(req1.indexes.size(), req2.indexes.size());
    BOOST_CHECK_EQUAL(req1.indexes[0], req2.indexes[0]);
    BOOST_CHECK_EQUAL(req1.indexes[1], req2.indexes[1]);
    BOOST_CHECK_EQUAL(req1.indexes[2], req2.indexes[2]);
    BOOST_CHECK_EQUAL(req1.indexes[3], req2.indexes[3]);
}